

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr xmlXPathWrapString(xmlChar *val)

{
  xmlXPathObjectPtr pxVar1;
  
  pxVar1 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
  if (pxVar1 == (xmlXPathObjectPtr)0x0) {
    (*xmlFree)(val);
    pxVar1 = (xmlXPathObjectPtr)0x0;
  }
  else {
    *(undefined8 *)pxVar1 = 0;
    pxVar1->nodesetval = (xmlNodeSetPtr)0x0;
    pxVar1->stringval = (xmlChar *)0x0;
    pxVar1->user = (void *)0x0;
    *(undefined8 *)&pxVar1->index = 0;
    pxVar1->user2 = (void *)0x0;
    *(undefined8 *)&pxVar1->boolval = 0;
    pxVar1->floatval = 0.0;
    *(undefined8 *)&pxVar1->index2 = 0;
    pxVar1->type = XPATH_STRING;
    pxVar1->stringval = val;
  }
  return pxVar1;
}

Assistant:

xmlXPathObjectPtr
xmlXPathWrapString (xmlChar *val) {
    xmlXPathObjectPtr ret;

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlFree(val);
	return(NULL);
    }
    memset(ret, 0 , sizeof(xmlXPathObject));
    ret->type = XPATH_STRING;
    ret->stringval = val;
    return(ret);
}